

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O0

HanabiMove __thiscall
hanabi_learning_env::HanabiGame::ConstructChanceOutcome(HanabiGame *this,int uid)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  HanabiGame *in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int8_t color;
  HanabiMove local_8;
  
  if ((-1 < in_ESI) &&
     (iVar1 = MaxChanceOutcomes((HanabiGame *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
     in_ESI < iVar1)) {
    iVar1 = NumRanks(in_RDI);
    iVar1 = in_ESI / iVar1;
    iVar2 = NumColors(in_RDI);
    color = (int8_t)(iVar1 % iVar2);
    iVar1 = NumRanks(in_RDI);
    HanabiMove::HanabiMove(&local_8,kDeal,-1,-1,color,(int8_t)(in_ESI % iVar1));
    return local_8;
  }
  HanabiMove::HanabiMove(&local_8,kInvalid,-1,-1,-1,-1);
  return local_8;
}

Assistant:

HanabiMove HanabiGame::ConstructChanceOutcome(int uid) const {
  if (uid < 0 || uid >= MaxChanceOutcomes()) {
    return HanabiMove(HanabiMove::kInvalid, /*card_index=*/-1,
                      /*target_offset=*/-1, /*color=*/-1, /*rank=*/-1);
  }
  return HanabiMove(HanabiMove::kDeal, /*card_index=*/-1,
                    /*target_offset=*/-1,
                    /*color=*/uid / NumRanks() % NumColors(),
                    /*rank=*/uid % NumRanks());
}